

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
* toml::detail::parse_utf8_codepoint<toml::type_config>(region *reg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  *in_RDI;
  source_location src_1;
  source_location src;
  string_type character;
  anon_class_1_0_00000001 to_char;
  istringstream iss;
  uint_least32_t codepoint;
  string str;
  source_location *in_stack_fffffffffffff9a8;
  uint_least32_t i;
  allocator<char> *f;
  source_location *in_stack_fffffffffffff9b0;
  size_type in_stack_fffffffffffff9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c8;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  region *in_stack_fffffffffffffa08;
  allocator<char> local_5e1 [9];
  region *in_stack_fffffffffffffa28;
  source_location *in_stack_fffffffffffffa30;
  allocator<char> local_541 [121];
  allocator<char> local_4c8 [48];
  string *in_stack_fffffffffffffb68;
  source_location *in_stack_fffffffffffffb70;
  string *in_stack_fffffffffffffb78;
  allocator<char> local_3f1 [160];
  allocator<char> local_351 [364];
  undefined1 local_1e5;
  string local_1d8 [32];
  istringstream local_1b8 [388];
  uint local_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this = &local_30;
  __s = in_RDI;
  region::as_string_abi_cxx11_(in_stack_fffffffffffffa08);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (in_stack_fffffffffffff9c8,(size_type)in_stack_fffffffffffff9c0,
             in_stack_fffffffffffff9b8);
  std::__cxx11::istringstream::istringstream(local_1b8,local_1d8,_S_in);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9b0);
  v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::istream::operator>>(local_1b8,CLI::std::hex);
  std::istream::operator>>(v,&local_34);
  local_1e5 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff9c0);
  if (local_34 < 0x80) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9b0,(char)((ulong)in_stack_fffffffffffff9a8 >> 0x38));
  }
  else {
    i = (uint_least32_t)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
    if (local_34 < 0x800) {
      parse_utf8_codepoint<toml::type_config>::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_fffffffffffff9b0,i);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9b0,(char)((ulong)in_stack_fffffffffffff9a8 >> 0x38));
      parse_utf8_codepoint<toml::type_config>::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_fffffffffffff9b0,
                 (uint_least32_t)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9b0,(char)((ulong)in_stack_fffffffffffff9a8 >> 0x38));
    }
    else if (local_34 < 0x10000) {
      if ((0xd7ff < local_34) && (local_34 < 0xe000)) {
        source_location::source_location(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,&__s->is_ok_,(allocator<char> *)in_RDI);
        source_location::source_location(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,&__s->is_ok_,(allocator<char> *)in_RDI);
        make_error_info<>(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
                          in_stack_fffffffffffffb68);
        err<toml::error_info>((error_info *)in_stack_fffffffffffffa08);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
        ::result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                  *)in_stack_fffffffffffff9b0,(failure_type *)in_stack_fffffffffffff9a8);
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x729b87);
        error_info::~error_info((error_info *)in_stack_fffffffffffff9b0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff9b0);
        std::allocator<char>::~allocator(local_3f1);
        source_location::~source_location(in_stack_fffffffffffff9b0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff9b0);
        std::allocator<char>::~allocator(local_351);
        source_location::~source_location(in_stack_fffffffffffff9b0);
        goto LAB_0072a086;
      }
      parse_utf8_codepoint<toml::type_config>::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_fffffffffffff9b0,i);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9b0,(char)((ulong)in_stack_fffffffffffff9a8 >> 0x38));
      parse_utf8_codepoint<toml::type_config>::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_fffffffffffff9b0,
                 (uint_least32_t)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9b0,(char)((ulong)in_stack_fffffffffffff9a8 >> 0x38));
      parse_utf8_codepoint<toml::type_config>::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_fffffffffffff9b0,
                 (uint_least32_t)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9b0,(char)((ulong)in_stack_fffffffffffff9a8 >> 0x38));
    }
    else {
      if (0x10ffff < local_34) {
        source_location::source_location(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,&__s->is_ok_,(allocator<char> *)in_RDI);
        source_location::source_location(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
        in_stack_fffffffffffff9b0 = (source_location *)local_5e1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,&__s->is_ok_,(allocator<char> *)in_RDI);
        make_error_info<>(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
                          in_stack_fffffffffffffb68);
        f = local_541 + 0x79;
        err<toml::error_info>((error_info *)in_stack_fffffffffffffa08);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
        ::result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                  *)in_stack_fffffffffffff9b0,(failure_type *)f);
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x729eff);
        error_info::~error_info((error_info *)in_stack_fffffffffffff9b0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff9b0);
        std::allocator<char>::~allocator(local_5e1);
        source_location::~source_location(in_stack_fffffffffffff9b0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff9b0);
        std::allocator<char>::~allocator(local_541);
        source_location::~source_location(in_stack_fffffffffffff9b0);
        goto LAB_0072a086;
      }
      parse_utf8_codepoint<toml::type_config>::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_fffffffffffff9b0,i);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9b0,(char)((ulong)in_stack_fffffffffffff9a8 >> 0x38));
      parse_utf8_codepoint<toml::type_config>::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_fffffffffffff9b0,
                 (uint_least32_t)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9b0,(char)((ulong)in_stack_fffffffffffff9a8 >> 0x38));
      parse_utf8_codepoint<toml::type_config>::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_fffffffffffff9b0,
                 (uint_least32_t)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9b0,(char)((ulong)in_stack_fffffffffffff9a8 >> 0x38));
      parse_utf8_codepoint<toml::type_config>::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)in_stack_fffffffffffff9b0,
                 (uint_least32_t)((ulong)in_stack_fffffffffffff9a8 >> 0x20));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9b0,(char)((ulong)in_stack_fffffffffffff9a8 >> 0x38));
    }
  }
  ok<std::__cxx11::string&>(v);
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  ::result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
            *)in_stack_fffffffffffff9b0,(success_type *)in_stack_fffffffffffff9a8);
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~success((success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x72a059);
LAB_0072a086:
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9b0);
  std::__cxx11::istringstream::~istringstream(local_1b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9b0);
  return __s;
}

Assistant:

result<typename basic_value<TC>::string_type, error_info>
parse_utf8_codepoint(const region& reg)
{
    using string_type = typename basic_value<TC>::string_type;
    using char_type = typename string_type::value_type;

    // assert(reg.as_lines().size() == 1); // XXX heavy check

    const auto str = reg.as_string();
    assert( ! str.empty());
    assert(str.front() == 'u' || str.front() == 'U' || str.front() == 'x');

    std::uint_least32_t codepoint;
    std::istringstream iss(str.substr(1));
    iss >> std::hex >> codepoint;

    const auto to_char = [](const std::uint_least32_t i) noexcept -> char_type {
        const auto uc = static_cast<unsigned char>(i & 0xFF);
        return cxx::bit_cast<char_type>(uc);
    };

    string_type character;
    if(codepoint < 0x80) // U+0000 ... U+0079 ; just an ASCII.
    {
        character += static_cast<char>(codepoint);
    }
    else if(codepoint < 0x800) //U+0080 ... U+07FF
    {
        // 110yyyyx 10xxxxxx; 0x3f == 0b0011'1111
        character += to_char(0xC0|(codepoint >> 6  ));
        character += to_char(0x80|(codepoint & 0x3F));
    }
    else if(codepoint < 0x10000) // U+0800...U+FFFF
    {
        if(0xD800 <= codepoint && codepoint <= 0xDFFF)
        {
            auto src = source_location(reg);
            return err(make_error_info("toml::parse_utf8_codepoint: "
                "[0xD800, 0xDFFF] is not a valid UTF-8",
                std::move(src), "here"));
        }
        assert(codepoint < 0xD800 || 0xDFFF < codepoint);
        // 1110yyyy 10yxxxxx 10xxxxxx
        character += to_char(0xE0| (codepoint >> 12));
        character += to_char(0x80|((codepoint >> 6 ) & 0x3F));
        character += to_char(0x80|((codepoint      ) & 0x3F));
    }
    else if(codepoint < 0x110000) // U+010000 ... U+10FFFF
    {
        // 11110yyy 10yyxxxx 10xxxxxx 10xxxxxx
        character += to_char(0xF0| (codepoint >> 18));
        character += to_char(0x80|((codepoint >> 12) & 0x3F));
        character += to_char(0x80|((codepoint >> 6 ) & 0x3F));
        character += to_char(0x80|((codepoint      ) & 0x3F));
    }
    else // out of UTF-8 region
    {
        auto src = source_location(reg);
        return err(make_error_info("toml::parse_utf8_codepoint: "
            "input codepoint is too large.",
            std::move(src), "must be in range [0x00, 0x10FFFF]"));
    }
    return ok(character);
}